

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Str.cpp
# Opt level: O1

shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
 __thiscall mbc::Val::Str::json_value(Str *this)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  undefined8 allocator;
  SizeType SVar1;
  int *piVar2;
  Data *name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  sVar3;
  Data local_68;
  Str *local_50;
  Data local_48;
  
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)0x0;
  piVar2 = (int *)operator_new(0x20);
  piVar2[2] = 1;
  piVar2[3] = 1;
  *(undefined ***)piVar2 = &PTR___Sp_counted_ptr_inplace_00140768;
  this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(piVar2 + 4);
  piVar2[4] = 0;
  piVar2[5] = 0;
  piVar2[6] = 0;
  piVar2[7] = 0;
  (this->super__ValAtom).super_ValBase.count_ = piVar2;
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)this_00;
  allocator = ValBase::doc_._16_8_;
  if (ValBase::doc_._16_8_ != 0) {
    (this_00->data_).n = (Number)0x0;
    piVar2[6] = 0;
    piVar2[7] = 0;
    *(undefined2 *)((long)piVar2 + 0x1e) = 3;
    name = &local_48;
    local_48.s.str = (Ch *)0x40500000012c0be;
    local_48.n = (Number)0x5;
    local_68.n = (Number)0x0;
    local_68.s.str = (Ch *)((ulong)(ushort)(**(byte **)(in_RSI + 0x18) + 9) << 0x30);
    local_50 = this;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&name->s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)allocator);
    local_68.n = **(Number **)(in_RSI + 0x30);
    local_48.n = (Number)0x0;
    local_48.s.str = (Ch *)0x0;
    SVar1 = rapidjson::GenericStringRef<char>::NotNullStrLen
                      ((GenericStringRef<char> *)&local_68.s,(char *)local_68.n);
    local_68._8_4_ = SVar1;
    if (SVar1 < 0xe) {
      local_48.ss.str[0xd] = '\r' - (char)SVar1;
      local_48.f.flags = 0x1c05;
    }
    else {
      local_48.f.flags = 0xc05;
      local_48.s.length = SVar1;
      name = (Data *)rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                               ((MemoryPoolAllocator<rapidjson::CrtAllocator> *)allocator,
                                (ulong)(SVar1 + 1));
      local_48.s.str = (Ch *)((ulong)local_48.s.str & 0xffff000000000000 | (ulong)name);
    }
    memcpy(name,(void *)local_68.n,(ulong)local_68.s.str & 0xffffffff);
    *(undefined1 *)((long)&(name->s).length + ((ulong)local_68.s.str & 0xffffffff)) = 0;
    local_68.s.str = (Ch *)0x40500000012df35;
    local_68.n = (Number)0x5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_68.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_48.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)allocator);
    sVar3.
    super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    sVar3.
    super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_50;
    return (shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
            )sVar3.
             super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __assert_fail("allocator_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/document.h"
                ,0x9bc,
                "Allocator &rapidjson::GenericDocument<rapidjson::UTF8<>>::GetAllocator() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

shared_ptr<Value> Str::json_value() {
    shared_ptr<Value> v = std::make_shared<Value>();
    auto& allo = doc_.GetAllocator();

    v -> SetObject();
    v -> AddMember("valid", *is_vaild_, allo);
    v -> AddMember("value", Value(value_->c_str(), allo).Move(), allo);

    return v;
}